

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O0

int __thiscall antlr::TokenBuffer::LA(TokenBuffer *this,uint i)

{
  int iVar1;
  Token *this_00;
  undefined4 in_ESI;
  size_t in_RDI;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_> *this_01;
  uint in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  fill((TokenBuffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  this_01 = (CircularQueue<antlr::TokenRefCount<antlr::Token>_> *)&stack0xffffffffffffffe8;
  CircularQueue<antlr::TokenRefCount<antlr::Token>_>::elementAt(this_01,in_RDI);
  this_00 = TokenRefCount<antlr::Token>::operator->((TokenRefCount<antlr::Token> *)this_01);
  iVar1 = (*this_00->_vptr_Token[6])();
  TokenRefCount<antlr::Token>::~TokenRefCount((TokenRefCount<antlr::Token> *)this_00);
  return iVar1;
}

Assistant:

int TokenBuffer::LA(unsigned int i)
{
	fill(i);
	return queue.elementAt(markerOffset+i-1)->getType();
}